

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

void iDynTree::reportWarning(char *className,char *methodName,char *errorMessage)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"[WARNING] ");
  poVar1 = std::operator<<(poVar1,className);
  poVar1 = std::operator<<(poVar1," :: ");
  poVar1 = std::operator<<(poVar1,methodName);
  poVar1 = std::operator<<(poVar1," : ");
  poVar1 = std::operator<<(poVar1,errorMessage);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void reportWarning(const char* className, const char* methodName, const char* errorMessage)
    {
        std::cerr << "[WARNING] " << className << " :: " << methodName << " : " << errorMessage <<  "\n";
    }